

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

Hash __thiscall
Fossilize::StateRecorder::Impl::get_application_link_hash(Impl *this,ResourceTag tag,Hash hash)

{
  Hash HVar1;
  Hash hash_local;
  ResourceTag tag_local;
  Impl *this_local;
  
  HVar1 = Hashing::compute_hash_application_info_link(&this->application_feature_hash,tag,hash);
  return HVar1;
}

Assistant:

Hash StateRecorder::Impl::get_application_link_hash(ResourceTag tag, Hash hash) const
{
	return Hashing::compute_hash_application_info_link(application_feature_hash, tag, hash);
}